

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  float *pfVar12;
  pointer pMVar13;
  float *pfVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  int iVar18;
  float *pfVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->c;
  uVar22 = (ulong)uVar1;
  uVar11 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar18 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 0) {
      if (0 < (int)uVar1) {
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          pfVar12 = (float *)(m->cstep * uVar10 * m->elemsize + (long)m->data);
          pfVar14 = (float *)(pMVar13[1].cstep * uVar10 * pMVar13[1].elemsize +
                             (long)pMVar13[1].data);
          pauVar16 = (undefined1 (*) [16])
                     (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar11 < 4) {
            uVar9 = 0;
          }
          else {
            iVar18 = 3;
            do {
              auVar27._0_4_ = *pfVar14 * *pfVar12;
              auVar27._4_4_ = pfVar14[1] * pfVar12[1];
              auVar27._8_4_ = pfVar14[2] * pfVar12[2];
              auVar27._12_4_ = pfVar14[3] * pfVar12[3];
              *pauVar16 = auVar27;
              pfVar12 = pfVar12 + 4;
              pfVar14 = pfVar14 + 4;
              pauVar16 = pauVar16 + 1;
              iVar18 = iVar18 + 4;
              uVar9 = uVar11 & 0xfffffffc;
            } while (iVar18 < (int)uVar11);
          }
          if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
            lVar21 = 0;
            do {
              *(float *)((long)*pauVar16 + lVar21 * 4) = pfVar14[lVar21] * pfVar12[lVar21];
              lVar21 = lVar21 + 1;
            } while (uVar11 - uVar9 != (int)lVar21);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar22);
      }
      pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar13 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar10 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar13 = pMVar13 + uVar10;
            uVar15 = 0;
            do {
              pfVar12 = (float *)(pMVar13->cstep * uVar15 * pMVar13->elemsize + (long)pMVar13->data)
              ;
              pauVar16 = (undefined1 (*) [16])
                         (this_00->cstep * uVar15 * this_00->elemsize + (long)this_00->data);
              uVar9 = 0;
              if (3 < (int)uVar11) {
                iVar18 = 3;
                do {
                  auVar24._0_4_ = *pfVar12 * *(float *)*pauVar16;
                  auVar24._4_4_ = pfVar12[1] * *(float *)((long)*pauVar16 + 4);
                  auVar24._8_4_ = pfVar12[2] * *(float *)((long)*pauVar16 + 8);
                  auVar24._12_4_ = pfVar12[3] * *(float *)((long)*pauVar16 + 0xc);
                  *pauVar16 = auVar24;
                  pfVar12 = pfVar12 + 4;
                  pauVar16 = pauVar16 + 1;
                  iVar18 = iVar18 + 4;
                  uVar9 = uVar11 & 0xfffffffc;
                } while (iVar18 < (int)uVar11);
              }
              if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
                lVar21 = 0;
                do {
                  *(float *)((long)*pauVar16 + lVar21 * 4) =
                       *(float *)((long)*pauVar16 + lVar21 * 4) * pfVar12[lVar21];
                  lVar21 = lVar21 + 1;
                } while (uVar11 - uVar9 != (int)lVar21);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar22);
          }
          uVar10 = uVar10 + 1;
          pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)(((long)(bottom_blobs->
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar13
                                  >> 3) * -0x71c71c71c71c71c7));
      }
    }
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 1) {
      pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)this->_vptr_Eltwise_x86[-3]) == 0) {
        if (0 < (int)uVar1) {
          uVar10 = 0;
          do {
            pfVar12 = (float *)(m->cstep * uVar10 * m->elemsize + (long)m->data);
            pfVar14 = (float *)(pMVar13[1].cstep * uVar10 * pMVar13[1].elemsize +
                               (long)pMVar13[1].data);
            pauVar16 = (undefined1 (*) [16])
                       (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar11 < 4) {
              uVar9 = 0;
            }
            else {
              iVar18 = 3;
              do {
                auVar25._0_4_ = *pfVar14 + *pfVar12;
                auVar25._4_4_ = pfVar14[1] + pfVar12[1];
                auVar25._8_4_ = pfVar14[2] + pfVar12[2];
                auVar25._12_4_ = pfVar14[3] + pfVar12[3];
                *pauVar16 = auVar25;
                pfVar12 = pfVar12 + 4;
                pfVar14 = pfVar14 + 4;
                pauVar16 = pauVar16 + 1;
                iVar18 = iVar18 + 4;
                uVar9 = uVar11 & 0xfffffffc;
              } while (iVar18 < (int)uVar11);
            }
            if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
              lVar21 = 0;
              do {
                *(float *)((long)*pauVar16 + lVar21 * 4) = pfVar14[lVar21] + pfVar12[lVar21];
                lVar21 = lVar21 + 1;
              } while (uVar11 - uVar9 != (int)lVar21);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar22);
        }
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar13 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar10 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar13 = pMVar13 + uVar10;
              uVar15 = 0;
              do {
                pfVar12 = (float *)(pMVar13->cstep * uVar15 * pMVar13->elemsize +
                                   (long)pMVar13->data);
                pauVar16 = (undefined1 (*) [16])
                           (this_00->cstep * uVar15 * this_00->elemsize + (long)this_00->data);
                uVar9 = 0;
                if (3 < (int)uVar11) {
                  iVar18 = 3;
                  do {
                    auVar26._0_4_ = *pfVar12 + *(float *)*pauVar16;
                    auVar26._4_4_ = pfVar12[1] + *(float *)((long)*pauVar16 + 4);
                    auVar26._8_4_ = pfVar12[2] + *(float *)((long)*pauVar16 + 8);
                    auVar26._12_4_ = pfVar12[3] + *(float *)((long)*pauVar16 + 0xc);
                    *pauVar16 = auVar26;
                    pfVar12 = pfVar12 + 4;
                    pauVar16 = pauVar16 + 1;
                    iVar18 = iVar18 + 4;
                    uVar9 = uVar11 & 0xfffffffc;
                  } while (iVar18 < (int)uVar11);
                }
                if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
                  lVar21 = 0;
                  do {
                    *(float *)((long)*pauVar16 + lVar21 * 4) =
                         *(float *)((long)*pauVar16 + lVar21 * 4) + pfVar12[lVar21];
                    lVar21 = lVar21 + 1;
                  } while (uVar11 - uVar9 != (int)lVar21);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar22);
            }
            uVar10 = uVar10 + 1;
            pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar10 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar13 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar1) {
          pp_Var2 = this->_vptr_Eltwise_x86;
          uVar10 = 0;
          do {
            pfVar12 = (float *)(m->cstep * uVar10 * m->elemsize + (long)m->data);
            pfVar14 = (float *)(pMVar13[1].cstep * uVar10 * pMVar13[1].elemsize +
                               (long)pMVar13[1].data);
            pfVar19 = (float *)(this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
            fVar23 = (float)**(undefined8 **)(&this->field_0xd8 + (long)pp_Var2[-3]);
            fVar28 = (float)((ulong)**(undefined8 **)(&this->field_0xd8 + (long)pp_Var2[-3]) >> 0x20
                            );
            if ((int)uVar11 < 4) {
              uVar9 = 0;
            }
            else {
              iVar18 = 3;
              do {
                fVar3 = pfVar12[1];
                fVar4 = pfVar12[2];
                fVar5 = pfVar12[3];
                fVar6 = pfVar14[1];
                fVar7 = pfVar14[2];
                fVar8 = pfVar14[3];
                *pfVar19 = *pfVar14 * fVar28 + *pfVar12 * fVar23;
                pfVar19[1] = fVar6 * fVar28 + fVar3 * fVar23;
                pfVar19[2] = fVar7 * fVar28 + fVar4 * fVar23;
                pfVar19[3] = fVar8 * fVar28 + fVar5 * fVar23;
                pfVar12 = pfVar12 + 4;
                pfVar14 = pfVar14 + 4;
                pfVar19 = pfVar19 + 4;
                iVar18 = iVar18 + 4;
                uVar9 = uVar11 & 0xfffffffc;
              } while (iVar18 < (int)uVar11);
            }
            if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
              lVar21 = 0;
              do {
                pfVar19[lVar21] = pfVar14[lVar21] * fVar28 + pfVar12[lVar21] * fVar23;
                lVar21 = lVar21 + 1;
              } while (uVar11 - uVar9 != (int)lVar21);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar22);
        }
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar13 >> 3) *
                       -0x71c71c71c71c71c7)) {
          pp_Var2 = this->_vptr_Eltwise_x86;
          uVar10 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar13 = pMVar13 + uVar10;
              uVar15 = 0;
              do {
                pfVar12 = (float *)(pMVar13->cstep * uVar15 * pMVar13->elemsize +
                                   (long)pMVar13->data);
                pfVar14 = (float *)(this_00->cstep * uVar15 * this_00->elemsize +
                                   (long)this_00->data);
                fVar23 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var2[-3]) + uVar10 * 4);
                uVar9 = 0;
                if (3 < (int)uVar11) {
                  iVar18 = 3;
                  do {
                    fVar28 = pfVar12[1];
                    fVar3 = pfVar12[2];
                    fVar4 = pfVar12[3];
                    *pfVar14 = *pfVar12 * fVar23 + *pfVar14;
                    pfVar14[1] = fVar28 * fVar23 + pfVar14[1];
                    pfVar14[2] = fVar3 * fVar23 + pfVar14[2];
                    pfVar14[3] = fVar4 * fVar23 + pfVar14[3];
                    pfVar12 = pfVar12 + 4;
                    pfVar14 = pfVar14 + 4;
                    iVar18 = iVar18 + 4;
                    uVar9 = uVar11 & 0xfffffffc;
                  } while (iVar18 < (int)uVar11);
                }
                if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
                  lVar21 = 0;
                  do {
                    pfVar14[lVar21] = pfVar12[lVar21] * fVar23 + pfVar14[lVar21];
                    lVar21 = lVar21 + 1;
                  } while (uVar11 - uVar9 != (int)lVar21);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar22);
            }
            uVar10 = uVar10 + 1;
            pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar10 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar13 >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar18 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 2) {
      if (0 < (int)uVar1) {
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          pauVar16 = (undefined1 (*) [16])(m->cstep * uVar10 * m->elemsize + (long)m->data);
          pauVar17 = (undefined1 (*) [16])
                     (pMVar13[1].cstep * uVar10 * pMVar13[1].elemsize + (long)pMVar13[1].data);
          pauVar20 = (undefined1 (*) [16])
                     (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar11 < 4) {
            uVar9 = 0;
          }
          else {
            iVar18 = 3;
            do {
              auVar27 = maxps(*pauVar16,*pauVar17);
              *pauVar20 = auVar27;
              pauVar16 = pauVar16 + 1;
              pauVar17 = pauVar17 + 1;
              pauVar20 = pauVar20 + 1;
              iVar18 = iVar18 + 4;
              uVar9 = uVar11 & 0xfffffffc;
            } while (iVar18 < (int)uVar11);
          }
          if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
            lVar21 = 0;
            do {
              fVar23 = *(float *)(*pauVar17 + lVar21 * 4);
              if (*(float *)(*pauVar17 + lVar21 * 4) <= *(float *)(*pauVar16 + lVar21 * 4)) {
                fVar23 = *(float *)(*pauVar16 + lVar21 * 4);
              }
              *(float *)((long)*pauVar20 + lVar21 * 4) = fVar23;
              lVar21 = lVar21 + 1;
            } while (uVar11 - uVar9 != (int)lVar21);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar22);
      }
      pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar18 = 0;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar13 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar10 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar13 = pMVar13 + uVar10;
            uVar15 = 0;
            do {
              pauVar16 = (undefined1 (*) [16])
                         (pMVar13->cstep * uVar15 * pMVar13->elemsize + (long)pMVar13->data);
              pauVar17 = (undefined1 (*) [16])
                         (this_00->cstep * uVar15 * this_00->elemsize + (long)this_00->data);
              uVar9 = 0;
              if (3 < (int)uVar11) {
                iVar18 = 3;
                do {
                  auVar27 = maxps(*pauVar17,*pauVar16);
                  *pauVar17 = auVar27;
                  pauVar16 = pauVar16 + 1;
                  pauVar17 = pauVar17 + 1;
                  iVar18 = iVar18 + 4;
                  uVar9 = uVar11 & 0xfffffffc;
                } while (iVar18 < (int)uVar11);
              }
              if (uVar11 - uVar9 != 0 && (int)uVar9 <= (int)uVar11) {
                lVar21 = 0;
                do {
                  fVar23 = *(float *)(*pauVar17 + lVar21 * 4);
                  if (*(float *)(*pauVar17 + lVar21 * 4) <= *(float *)(*pauVar16 + lVar21 * 4)) {
                    fVar23 = *(float *)(*pauVar16 + lVar21 * 4);
                  }
                  *(float *)(*pauVar17 + lVar21 * 4) = fVar23;
                  lVar21 = lVar21 + 1;
                } while (uVar11 - uVar9 != (int)lVar21);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar22);
          }
          uVar10 = uVar10 + 1;
          pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)(((long)(bottom_blobs->
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar13
                                  >> 3) * -0x71c71c71c71c71c7));
        iVar18 = 0;
      }
    }
  }
  return iVar18;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}